

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_histogram.c
# Opt level: O3

REF_STATUS ref_histogram_gather(REF_HISTOGRAM ref_histogram,REF_MPI ref_mpi)

{
  int iVar1;
  REF_INT *pRVar2;
  uint uVar3;
  void *output;
  int iVar4;
  long lVar5;
  undefined8 uVar6;
  char *pcVar7;
  REF_DBL log_total;
  REF_DBL max;
  REF_DBL min;
  double local_40;
  REF_DBL local_38;
  REF_DBL local_30;
  
  iVar1 = ref_histogram->nbin;
  if ((long)iVar1 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_histogram.c",
           0x79,"ref_histogram_gather","malloc bins of REF_INT negative");
    return 1;
  }
  output = malloc((long)iVar1 * 4);
  if (output == (void *)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_histogram.c",
           0x79,"ref_histogram_gather","malloc bins of REF_INT NULL");
    return 2;
  }
  uVar3 = ref_mpi_sum(ref_mpi,ref_histogram->bins,output,iVar1,1);
  if (uVar3 != 0) {
    pcVar7 = "sum";
    uVar6 = 0x7d;
    goto LAB_00113afd;
  }
  uVar3 = ref_mpi_max(ref_mpi,ref_histogram,&local_38,3);
  if (uVar3 != 0) {
    pcVar7 = "max";
    uVar6 = 0x80;
    goto LAB_00113afd;
  }
  uVar3 = ref_mpi_min(ref_mpi,&ref_histogram->min,&local_30,3);
  if (uVar3 != 0) {
    pcVar7 = "min";
    uVar6 = 0x83;
    goto LAB_00113afd;
  }
  uVar3 = ref_mpi_sum(ref_mpi,&ref_histogram->log_total,&local_40,1,3);
  if (uVar3 != 0) {
    pcVar7 = "log_total";
    uVar6 = 0x86;
    goto LAB_00113afd;
  }
  if (ref_mpi->id == 0) {
    ref_histogram->max = local_38;
    ref_histogram->min = local_30;
    ref_histogram->log_total = local_40;
    if (ref_histogram->nbin < 1) goto LAB_00113ab5;
    pRVar2 = ref_histogram->bins;
    lVar5 = 0;
    do {
      pRVar2[lVar5] = *(REF_INT *)((long)output + lVar5 * 4);
      lVar5 = lVar5 + 1;
      iVar1 = ref_histogram->nbin;
    } while (lVar5 < iVar1);
    if (iVar1 < 1) goto LAB_00113ab5;
    lVar5 = 0;
    iVar4 = 0;
    do {
      iVar4 = iVar4 + ref_histogram->bins[lVar5];
      lVar5 = lVar5 + 1;
    } while (iVar1 != lVar5);
    ref_histogram->log_mean = 0.0;
    if (0 < iVar4) {
      ref_histogram->log_mean = local_40 / (double)iVar4;
    }
  }
  else {
    ref_histogram->max = -1e+20;
    ref_histogram->min = 1e+20;
    ref_histogram->log_total = 0.0;
    if (0 < ref_histogram->nbin) {
      pRVar2 = ref_histogram->bins;
      lVar5 = 0;
      do {
        pRVar2[lVar5] = 0;
        lVar5 = lVar5 + 1;
      } while (lVar5 < ref_histogram->nbin);
    }
LAB_00113ab5:
    ref_histogram->log_mean = 0.0;
  }
  uVar3 = ref_mpi_bcast(ref_mpi,&ref_histogram->log_mean,1,3);
  if (uVar3 == 0) {
    free(output);
    return 0;
  }
  pcVar7 = "log_mean";
  uVar6 = 0x9f;
LAB_00113afd:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_histogram.c",uVar6
         ,"ref_histogram_gather",(ulong)uVar3,pcVar7);
  return uVar3;
}

Assistant:

REF_FCN REF_STATUS ref_histogram_gather(REF_HISTOGRAM ref_histogram,
                                        REF_MPI ref_mpi) {
  REF_INT *bins;
  REF_DBL min, max, log_total;
  REF_INT i, observations;

  ref_malloc(bins, ref_histogram_nbin(ref_histogram), REF_INT);

  RSS(ref_mpi_sum(ref_mpi, ref_histogram->bins, bins,
                  ref_histogram_nbin(ref_histogram), REF_INT_TYPE),
      "sum");
  RSS(ref_mpi_max(ref_mpi, &ref_histogram_max(ref_histogram), &max,
                  REF_DBL_TYPE),
      "max");
  RSS(ref_mpi_min(ref_mpi, &ref_histogram_min(ref_histogram), &min,
                  REF_DBL_TYPE),
      "min");
  RSS(ref_mpi_sum(ref_mpi, &ref_histogram_log_total(ref_histogram), &log_total,
                  1, REF_DBL_TYPE),
      "log_total");

  if (ref_mpi_once(ref_mpi)) {
    ref_histogram_max(ref_histogram) = max;
    ref_histogram_min(ref_histogram) = min;
    ref_histogram_log_total(ref_histogram) = log_total;
    for (i = 0; i < ref_histogram_nbin(ref_histogram); i++)
      ref_histogram->bins[i] = bins[i];
    observations = 0;
    for (i = 0; i < ref_histogram_nbin(ref_histogram); i++)
      observations += ref_histogram->bins[i];
    ref_histogram_log_mean(ref_histogram) = 0.0;
    if (observations > 0)
      ref_histogram_log_mean(ref_histogram) = log_total / (REF_DBL)observations;
  } else {
    ref_histogram_max(ref_histogram) = -1.0e20;
    ref_histogram_min(ref_histogram) = 1.0e20;
    ref_histogram_log_total(ref_histogram) = 0.0;
    for (i = 0; i < ref_histogram_nbin(ref_histogram); i++)
      ref_histogram->bins[i] = 0;
    ref_histogram_log_mean(ref_histogram) = 0.0;
  }

  RSS(ref_mpi_bcast(ref_mpi, &ref_histogram_log_mean(ref_histogram), 1,
                    REF_DBL_TYPE),
      "log_mean");

  ref_free(bins);

  return REF_SUCCESS;
}